

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

uint8_t * __thiscall
proto2_unittest::TestMessageSetLite::_InternalSerialize
          (TestMessageSetLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint size;
  ulong uVar1;
  uint8_t *puVar2;
  undefined8 *puVar3;
  
  puVar2 = google::protobuf::internal::ExtensionSet::
           InternalSerializeMessageSetWithCachedSizesToArray
                     (&(this->field_0)._impl_._extensions_,
                      (MessageLite *)_TestMessageSetLite_default_instance_,target,stream);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    puVar3 = &google::protobuf::internal::fixed_address_empty_string;
    if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
      google::protobuf::internal::InitProtobufDefaultsSlow();
    }
  }
  else {
    puVar3 = (undefined8 *)((uVar1 & 0xfffffffffffffffe) + 8);
  }
  size = *(uint *)(puVar3 + 1);
  if ((long)(int)size <= (long)stream->end_ - (long)puVar2) {
    memcpy(puVar2,(void *)*puVar3,(ulong)size);
    return puVar2 + (int)size;
  }
  puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                     (stream,(void *)*puVar3,size,puVar2);
  return puVar2;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMessageSetLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMessageSetLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
   target =
      this_._impl_._extensions_
          .InternalSerializeMessageSetWithCachedSizesToArray(
              &default_instance(), target, stream);
  target = ::_pbi::InternalSerializeUnknownMessageSetItemsToArray(
      this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString), target, stream);
  return target;
}